

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void add_s(MatchState *ms,luaL_Buffer *b,char *s,char *e)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  ushort **ppuVar4;
  char *news;
  size_t i;
  size_t l;
  char *e_local;
  char *s_local;
  luaL_Buffer *b_local;
  MatchState *ms_local;
  
  l = (size_t)e;
  e_local = s;
  s_local = (char *)b;
  b_local = (luaL_Buffer *)ms;
  pcVar3 = lua_tolstring(ms->L,3,&i);
  for (news = (char *)0x0; news < i; news = news + 1) {
    if (pcVar3[(long)news] == '%') {
      news = news + 1;
      ppuVar4 = __ctype_b_loc();
      if (((*ppuVar4)[(int)(uint)(byte)pcVar3[(long)news]] & 0x800) == 0) {
        if (s_local + 0x2018 <= *(char **)s_local) {
          luaL_prepbuffer((luaL_Buffer *)s_local);
        }
        cVar1 = pcVar3[(long)news];
        pcVar2 = *(char **)s_local;
        *(char **)s_local = pcVar2 + 1;
        *pcVar2 = cVar1;
      }
      else if (pcVar3[(long)news] == '0') {
        luaL_addlstring((luaL_Buffer *)s_local,e_local,l - (long)e_local);
      }
      else {
        push_onecapture((MatchState *)b_local,pcVar3[(long)news] + -0x31,e_local,(char *)l);
        luaL_addvalue((luaL_Buffer *)s_local);
      }
    }
    else {
      if (s_local + 0x2018 <= *(char **)s_local) {
        luaL_prepbuffer((luaL_Buffer *)s_local);
      }
      cVar1 = pcVar3[(long)news];
      pcVar2 = *(char **)s_local;
      *(char **)s_local = pcVar2 + 1;
      *pcVar2 = cVar1;
    }
  }
  return;
}

Assistant:

static void add_s(MatchState*ms,luaL_Buffer*b,const char*s,
const char*e){
size_t l,i;
const char*news=lua_tolstring(ms->L,3,&l);
for(i=0;i<l;i++){
if(news[i]!='%')
luaL_addchar(b,news[i]);
else{
i++;
if(!isdigit(uchar(news[i])))
luaL_addchar(b,news[i]);
else if(news[i]=='0')
luaL_addlstring(b,s,e-s);
else{
push_onecapture(ms,news[i]-'1',s,e);
luaL_addvalue(b);
}
}
}
}